

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::CreationErrorsTest::iterate(CreationErrorsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  int iVar4;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint framebuffer;
  Enum<int,_2UL> local_1b0;
  undefined1 local_1a0 [384];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    (**(code **)(lVar5 + 0x3c0))(0xffffffffffffffff);
    iVar3 = (**(code **)(lVar5 + 0x800))();
    if (iVar3 != 0x501) {
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"CreateFramebuffers generated ");
      local_1b0.m_getName = glu::getErrorName;
      local_1b0.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b0,(ostream *)this_00);
      std::operator<<((ostream *)this_00,
                      " error when called with negative number of framebuffers, but GL_INVALID_VALUE was expected."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    do {
      iVar4 = (**(code **)(lVar5 + 0x800))();
    } while (iVar4 != 0);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (iVar3 == 0x501) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok = true;

	/* Framebuffer object */
	glw::GLuint framebuffer = 0;

	/* Check direct state creation of negative numbers of framebuffers. */
	gl.createFramebuffers(-1, &framebuffer);

	glw::GLenum error = GL_NO_ERROR;

	if (GL_INVALID_VALUE != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "CreateFramebuffers generated " << glu::getErrorStr(error)
			<< " error when called with negative number of framebuffers, but GL_INVALID_VALUE was expected."
			<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Cleanup (sanity). */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}